

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.c
# Opt level: O0

void pnga_bin_sorter(Integer g_bin,Integer g_cnt,Integer g_off)

{
  int num;
  logical lVar1;
  void *pvVar2;
  Integer in_RDI;
  int elems;
  Integer i;
  Integer *ptr;
  Integer *bin_cnt;
  Integer rhi [2];
  Integer rlo [2];
  Integer bin_range [2];
  Integer g_range;
  Integer crap;
  Integer me;
  Integer hi;
  Integer lo;
  Integer ndim;
  Integer type;
  Integer totbin;
  Integer nbin;
  Integer in_stack_000000e8;
  char *in_stack_000000f0;
  Integer *in_stack_00000100;
  void *in_stack_00000108;
  Integer *in_stack_00000110;
  Integer *in_stack_00000118;
  Integer in_stack_00000120;
  Integer *in_stack_00000158;
  Integer *in_stack_00000160;
  Integer *in_stack_00000168;
  Integer in_stack_00000170;
  Integer *in_stack_00000258;
  Integer *in_stack_00000260;
  Integer in_stack_00000268;
  Integer in_stack_00000270;
  Integer *in_stack_00000330;
  void *in_stack_00000338;
  Integer *in_stack_00000340;
  Integer *in_stack_00000348;
  Integer in_stack_00000350;
  long local_b0;
  Integer *local_a8;
  long local_78;
  long local_70;
  long local_48;
  long local_40;
  long local_38;
  long local_28;
  long local_20;
  Integer local_8;
  
  local_8 = in_RDI;
  pnga_nodeid();
  lVar1 = pnga_create_bin_range(type,ndim,lo,(Integer *)hi);
  if (lVar1 == 0) {
    pnga_error(in_stack_000000f0,in_stack_000000e8);
  }
  pnga_inquire(in_stack_00000170,in_stack_00000168,in_stack_00000160,in_stack_00000158);
  if (local_38 != 1) {
    pnga_error(in_stack_000000f0,in_stack_000000e8);
  }
  pnga_distribution(in_stack_00000270,in_stack_00000268,in_stack_00000260,in_stack_00000258);
  if (0 < local_40) {
    pnga_get(in_stack_00000120,in_stack_00000118,in_stack_00000110,in_stack_00000108,
             in_stack_00000100);
    local_20 = (local_70 - local_78) + 1;
    if (((local_20 < 1) || (local_28 < local_20)) || ((local_48 - local_40) + 1 < local_20)) {
      pnga_error(in_stack_000000f0,in_stack_000000e8);
    }
    pvVar2 = malloc(local_20 << 3);
    if (pvVar2 == (void *)0x0) {
      pnga_error(in_stack_000000f0,in_stack_000000e8);
    }
    pnga_get(in_stack_00000120,in_stack_00000118,in_stack_00000110,in_stack_00000108,
             in_stack_00000100);
    pnga_access_ptr(in_stack_00000350,in_stack_00000348,in_stack_00000340,in_stack_00000338,
                    in_stack_00000330);
    for (local_b0 = 0; local_b0 < local_20; local_b0 = local_b0 + 1) {
      num = (int)*(undefined8 *)((long)pvVar2 + local_b0 * 8);
      gai_hsort(local_a8,num);
      local_a8 = local_a8 + num;
    }
    pnga_release_update(local_8,&local_40,&local_48);
  }
  pnga_sync();
  return;
}

Assistant:

void pnga_bin_sorter(Integer g_bin, Integer g_cnt, Integer g_off)
{
Integer nbin,totbin,type,ndim,lo,hi,me=pnga_nodeid(),crap;
Integer g_range;

    if(FALSE==pnga_create_bin_range(g_bin, g_cnt, g_off, &g_range))
        pnga_error("ga_bin_sorter: failed to create temp bin range array",0); 

    pnga_inquire(g_bin, &type, &ndim, &totbin);
    if(ndim !=1) pnga_error("ga_bin_sorter: 1-dim array required",ndim);
     
    pnga_distribution(g_bin, me, &lo, &hi);
    if (lo > 0 ){ /* we get 0 if no elements stored on this process */
        Integer bin_range[2], rlo[2],rhi[2];
        Integer *bin_cnt, *ptr, i;

        /* get and inspect range of bins stored on current processor */
        rlo[0] = 1; rlo[1]= me+1; rhi[0]=2; rhi[1]=rlo[1];
        pnga_get(g_range, rlo, rhi, bin_range, rhi); /* local */
        nbin = bin_range[1]-bin_range[0]+1;
        if(nbin<1 || nbin> totbin || nbin>(hi-lo+1))
           pnga_error("ga_bin_sorter:bad nbin",nbin);

        /* get count of elements in each bin stored on this task */
        if(!(bin_cnt = (Integer*)malloc(nbin*sizeof(Integer))))
           pnga_error("ga_bin_sorter:memory allocation failed",nbin);
        pnga_get(g_cnt,bin_range,bin_range+1,bin_cnt,&nbin);

        /* get access to local bin elements */
        pnga_access_ptr(g_bin, &lo, &hi, &ptr, &crap);
        
        for(i=0;i<nbin;i++){ 
            int elems =(int) bin_cnt[i];
            gai_hsort(ptr, elems);
            ptr+=elems;
        }
        pnga_release_update(g_bin, &lo, &hi);             
    }

    pnga_sync();
}